

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O0

void cppurses::System::post_event<cppurses::Timer_event,cppurses::Widget&>(Widget *args)

{
  unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> local_20;
  undefined1 local_18 [8];
  __single_object event;
  Widget *args_local;
  
  event._M_t.
  super___uniq_ptr_impl<cppurses::Timer_event,_std::default_delete<cppurses::Timer_event>_>._M_t.
  super__Tuple_impl<0UL,_cppurses::Timer_event_*,_std::default_delete<cppurses::Timer_event>_>.
  super__Head_base<0UL,_cppurses::Timer_event_*,_false>._M_head_impl =
       (__uniq_ptr_data<cppurses::Timer_event,_std::default_delete<cppurses::Timer_event>,_true,_true>
        )(__uniq_ptr_data<cppurses::Timer_event,_std::default_delete<cppurses::Timer_event>,_true,_true>
          )args;
  std::make_unique<cppurses::Timer_event,cppurses::Widget&>((Widget *)local_18);
  std::unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>>::
  unique_ptr<cppurses::Timer_event,std::default_delete<cppurses::Timer_event>,void>
            ((unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>> *)&local_20,
             (unique_ptr<cppurses::Timer_event,_std::default_delete<cppurses::Timer_event>_> *)
             local_18);
  post_event(&local_20);
  std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::~unique_ptr(&local_20);
  std::unique_ptr<cppurses::Timer_event,_std::default_delete<cppurses::Timer_event>_>::~unique_ptr
            ((unique_ptr<cppurses::Timer_event,_std::default_delete<cppurses::Timer_event>_> *)
             local_18);
  return;
}

Assistant:

static void post_event(Args&&... args)
    {
        auto event = std::make_unique<T>(std::forward<Args>(args)...);
        System::post_event(std::move(event));
    }